

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O1

void duckdb::MapExtractListFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  int iVar1;
  idx_t count;
  uint64_t uVar2;
  data_ptr_t pdVar3;
  reference vector;
  reference target_v;
  Vector *source_v;
  Vector *this;
  idx_t iVar4;
  list_entry_t *plVar5;
  list_entry_t *plVar6;
  idx_t iVar7;
  idx_t iVar8;
  uint64_t *puVar9;
  uint64_t uVar10;
  UnifiedVectorFormat pos_format;
  UnifiedVectorFormat lst_format;
  Vector pos_vec;
  UnifiedVectorFormat val_format;
  LogicalType local_188;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  Vector local_e0;
  UnifiedVectorFormat local_78;
  
  count = args->count;
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  target_v = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if (((vector->type).id_ != SQLNULL) && ((target_v->type).id_ != SQLNULL)) {
    source_v = MapVector::GetKeys(vector);
    this = MapVector::GetValues(vector);
    LogicalType::LogicalType(&local_188,INTEGER);
    Vector::Vector(&local_e0,&local_188,count);
    LogicalType::~LogicalType(&local_188);
    ListSearchOp<true>(vector,source_v,target_v,&local_e0,args->count);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_170);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
    iVar4 = ListVector::GetListSize(vector);
    Vector::ToUnifiedFormat(this,iVar4,&local_78);
    Vector::ToUnifiedFormat(&local_e0,count,&local_170);
    Vector::ToUnifiedFormat(vector,count,&local_128);
    plVar5 = ListVector::GetData(vector);
    plVar6 = ListVector::GetData(result);
    if (count != 0) {
      puVar9 = &plVar6->length;
      uVar10 = 0;
      iVar4 = 0;
      do {
        iVar7 = iVar4;
        if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)(local_128.sel)->sel_vector[iVar4];
        }
        if ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
             >> (iVar7 & 0x3f) & 1) != 0)) {
          iVar8 = iVar4;
          if ((local_170.sel)->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)(local_170.sel)->sel_vector[iVar4];
          }
          if ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) {
            uVar2 = plVar5[iVar7].offset;
            iVar1 = *(int *)(local_170.data + iVar8 * 4);
            ((list_entry_t *)(puVar9 + -1))->offset = uVar10;
            *puVar9 = 1;
            ListVector::Append(result,this,(long)iVar1 + uVar2,((long)iVar1 + uVar2) - 1);
            uVar10 = uVar10 + 1;
          }
          else {
            ((list_entry_t *)(puVar9 + -1))->offset = uVar10;
            *puVar9 = 0;
          }
        }
        else {
          FlatVector::SetNull(result,iVar4,true);
        }
        iVar4 = iVar4 + 1;
        puVar9 = puVar9 + 2;
      } while (count != iVar4);
    }
    if (args->count == 1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    Vector::Verify(result,count);
    if (local_128.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_170.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_e0.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_e0.type);
    return;
  }
  ListVector::SetListSize(result,0);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  pdVar3 = result->data;
  pdVar3[0] = '\0';
  pdVar3[1] = '\0';
  pdVar3[2] = '\0';
  pdVar3[3] = '\0';
  pdVar3[4] = '\0';
  pdVar3[5] = '\0';
  pdVar3[6] = '\0';
  pdVar3[7] = '\0';
  pdVar3[8] = '\0';
  pdVar3[9] = '\0';
  pdVar3[10] = '\0';
  pdVar3[0xb] = '\0';
  pdVar3[0xc] = '\0';
  pdVar3[0xd] = '\0';
  pdVar3[0xe] = '\0';
  pdVar3[0xf] = '\0';
  Vector::Verify(result,count);
  return;
}

Assistant:

static void MapExtractListFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		ListVector::SetListSize(result, 0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<list_entry_t>(result)[0] = {0, 0};
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	val_vec.ToUnifiedFormat(ListVector::GetListSize(map_vec), val_format);
	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);
	const auto out_list_data = ListVector::GetData(result);

	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		const auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		auto &inc_list = inc_list_data[lst_idx];
		auto &out_list = out_list_data[row_idx];

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return emptyl ist
			out_list.offset = offset;
			out_list.length = 0;
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list.offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		out_list.offset = offset;
		out_list.length = 1;
		ListVector::Append(result, val_vec, pos + 1, pos);
		offset++;
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}